

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIFFImageHandler.cpp
# Opt level: O1

void __thiscall
TIFFImageHandler::SamplePlanarSeparateToContig
          (TIFFImageHandler *this,uchar *inBuffer,uchar *inSamplebuffer,tsize_t inSamplebuffersize)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  uchar *puVar4;
  ulong uVar5;
  
  lVar1 = inSamplebuffersize / (long)(ulong)this->mT2p->tiff_samplesperpixel;
  if (0 < lVar1) {
    lVar2 = 0;
    do {
      uVar3 = (ulong)this->mT2p->tiff_samplesperpixel;
      if (uVar3 != 0) {
        uVar5 = 0;
        puVar4 = inSamplebuffer;
        do {
          inBuffer[uVar5 + uVar3 * lVar2] = *puVar4;
          uVar5 = uVar5 + 1;
          uVar3 = (ulong)this->mT2p->tiff_samplesperpixel;
          puVar4 = puVar4 + lVar1;
        } while (uVar5 < uVar3);
      }
      lVar2 = lVar2 + 1;
      inSamplebuffer = inSamplebuffer + 1;
    } while (lVar2 != lVar1);
  }
  return;
}

Assistant:

void TIFFImageHandler::SamplePlanarSeparateToContig(unsigned char* inBuffer, 
													unsigned char* inSamplebuffer, 
													tsize_t inSamplebuffersize)
{
	tsize_t stride=0;
	tsize_t i=0;
	tsize_t j=0;
	
	stride=inSamplebuffersize/mT2p->tiff_samplesperpixel;
	for(i=0;i<stride;i++){
		for(j=0;j<mT2p->tiff_samplesperpixel;j++){
			inBuffer[i*mT2p->tiff_samplesperpixel + j] = inSamplebuffer[i + j*stride];
		}
	}
}